

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBColorTable(uint8_t *dst_argb,int dst_stride_argb,uint8_t *table_argb,int dst_x,int dst_y,
                  int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  uint8_t *puVar5;
  int iVar6;
  bool bVar7;
  
  iVar6 = -1;
  if ((((-1 < (dst_y | dst_x)) && (dst_argb != (uint8_t *)0x0)) && (table_argb != (uint8_t *)0x0))
     && ((0 < width && (0 < height)))) {
    bVar7 = width * 4 != dst_stride_argb;
    iVar6 = 0;
    if (bVar7) {
      iVar6 = dst_stride_argb;
    }
    iVar3 = height;
    iVar1 = 1;
    if (!bVar7) {
      iVar3 = 1;
      iVar1 = height;
    }
    iVar2 = libyuv::TestCpuFlag(0x10);
    if (iVar2 == 0) {
      pcVar4 = ARGBColorTableRow_C;
    }
    else {
      pcVar4 = ARGBColorTableRow_X86;
    }
    puVar5 = dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2);
    while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
      (*pcVar4)(puVar5,table_argb,iVar1 * width);
      puVar5 = puVar5 + iVar6;
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

LIBYUV_API
int ARGBColorTable(uint8_t* dst_argb,
                   int dst_stride_argb,
                   const uint8_t* table_argb,
                   int dst_x,
                   int dst_y,
                   int width,
                   int height) {
  int y;
  void (*ARGBColorTableRow)(uint8_t * dst_argb, const uint8_t* table_argb,
                            int width) = ARGBColorTableRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || !table_argb || width <= 0 || height <= 0 || dst_x < 0 ||
      dst_y < 0) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_ARGBCOLORTABLEROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    ARGBColorTableRow = ARGBColorTableRow_X86;
  }
#endif
  for (y = 0; y < height; ++y) {
    ARGBColorTableRow(dst, table_argb, width);
    dst += dst_stride_argb;
  }
  return 0;
}